

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

RPCHelpMan * wallet::gettransaction(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe008;
  allocator<RPCResult> *paVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffe010;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe038;
  RPCResult *in_stack_ffffffffffffe040;
  RPCResult *in_stack_ffffffffffffe048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe050;
  undefined7 in_stack_ffffffffffffe058;
  undefined1 in_stack_ffffffffffffe05f;
  string *in_stack_ffffffffffffe060;
  undefined7 in_stack_ffffffffffffe068;
  undefined1 in_stack_ffffffffffffe06f;
  undefined4 in_stack_ffffffffffffe070;
  Type in_stack_ffffffffffffe074;
  string *in_stack_ffffffffffffe078;
  undefined4 in_stack_ffffffffffffe080;
  Type in_stack_ffffffffffffe084;
  undefined4 in_stack_ffffffffffffe088;
  Type in_stack_ffffffffffffe08c;
  RPCResult *in_stack_ffffffffffffe090;
  undefined1 *local_1ec0;
  RPCExamples *in_stack_ffffffffffffe150;
  undefined1 *puVar4;
  RPCResults *in_stack_ffffffffffffe158;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe160;
  string *in_stack_ffffffffffffe168;
  string *in_stack_ffffffffffffe170;
  RPCHelpMan *in_stack_ffffffffffffe178;
  undefined1 *local_1e78;
  undefined1 *local_1e60;
  undefined1 *local_1e48;
  undefined1 *local_1e30;
  RPCMethodImpl *fun;
  undefined1 local_1a98 [39];
  allocator<char> local_1a71;
  allocator<char> local_1a70;
  allocator<char> local_1a6f;
  allocator<char> local_1a6e;
  allocator<char> local_1a6d;
  allocator<char> local_1a6c;
  allocator<char> local_1a6b [3];
  pointer local_1a68;
  pointer pRStack_1a60;
  undefined1 local_1a58 [15];
  allocator<char> local_1a49 [31];
  allocator<char> local_1a2a;
  allocator<char> local_1a29 [28];
  allocator<char> local_1a0d;
  allocator<char> local_1a0c [12];
  undefined8 uStack_1a00;
  _Alloc_hider local_19f8;
  allocator<char> local_19ea;
  allocator<char> local_19e9 [31];
  allocator<char> local_19ca;
  allocator<char> local_19c9;
  size_type local_19c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_19c0;
  allocator<char> local_19aa;
  allocator<char> local_19a9;
  pointer local_19a8;
  pointer pbStack_19a0;
  undefined8 local_1998;
  allocator<char> local_1989;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  allocator<char> local_196a;
  allocator<char> local_1969;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  allocator<char> local_194a;
  allocator<char> local_1949;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  allocator<char> local_1929;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  allocator<char> local_190a;
  allocator<char> local_1909;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  allocator<char> local_18ea;
  allocator<char> local_18e9;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  allocator<char> local_18c2;
  allocator<char> local_18c1 [31];
  allocator<char> local_18a2;
  allocator<char> local_18a1 [31];
  allocator<char> local_1882;
  allocator<char> local_1881 [57];
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  allocator<char> local_1829;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  allocator<char> local_1801 [79];
  allocator<char> local_17b2;
  allocator<char> local_17b1 [26];
  allocator<char> local_1797;
  undefined1 local_1796;
  allocator<char> local_1795;
  allocator<char> local_1794;
  allocator<char> local_1793;
  allocator<char> local_1792;
  allocator<char> local_1791;
  undefined4 local_1790;
  allocator<char> local_1789 [31];
  allocator<char> local_176a;
  allocator<char> local_1769 [577];
  undefined1 local_1528 [136];
  undefined1 local_14a0 [192];
  undefined1 local_13e0 [136];
  undefined1 local_1358 [608];
  undefined1 local_10f8 [248];
  undefined8 local_1000;
  undefined1 local_c30 [64];
  undefined1 local_bf0 [136];
  undefined1 local_b68 [64];
  undefined1 local_b28 [136];
  RPCMethodImpl local_aa0 [12];
  undefined1 local_908 [160];
  undefined1 local_868 [272];
  undefined1 local_758 [200];
  undefined1 local_690;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined1 local_650;
  undefined1 local_64f;
  undefined1 local_550;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined1 local_510;
  undefined1 local_50f;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1790 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe018,&in_stack_ffffffffffffe010->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe020);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe008);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
                 in_stack_ffffffffffffe078,in_stack_ffffffffffffe074,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
                 in_stack_ffffffffffffe060,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe018,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_550 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe020);
  local_528 = 0;
  uStack_520 = 0;
  local_518 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe008);
  local_510 = 0;
  local_50f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
                 in_stack_ffffffffffffe078,in_stack_ffffffffffffe074,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
                 in_stack_ffffffffffffe060,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1796 = 0;
  UniValue::UniValue<bool,_bool,_true>
            ((UniValue *)in_stack_ffffffffffffe048,(bool *)in_stack_ffffffffffffe040);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe018,in_stack_ffffffffffffe010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_690 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe020);
  local_668 = 0;
  uStack_660 = 0;
  local_658 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe008);
  local_650 = 0;
  local_64f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
                 in_stack_ffffffffffffe078,in_stack_ffffffffffffe074,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
                 in_stack_ffffffffffffe060,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe008);
  __l._M_len._0_7_ = in_stack_ffffffffffffe058;
  __l._M_array = (iterator)in_stack_ffffffffffffe050;
  __l._M_len._7_1_ = in_stack_ffffffffffffe05f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe048,__l,
             (allocator_type *)in_stack_ffffffffffffe040);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
                 in_stack_ffffffffffffe050);
  local_1828 = 0;
  uStack_1820 = 0;
  local_1818 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe008);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
                 in_stack_ffffffffffffe050);
  std::operator+(in_stack_ffffffffffffe020,(char *)in_stack_ffffffffffffe018);
  local_1848 = 0;
  uStack_1840 = 0;
  local_1838 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe008);
  paVar2 = (allocator<RPCResult> *)((ulong)in_stack_ffffffffffffe008 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             in_stack_ffffffffffffe084,in_stack_ffffffffffffe078,
             SUB41(in_stack_ffffffffffffe074 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe060,
             (bool)in_stack_ffffffffffffe05f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe058;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe050;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe05f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe048,__l_00,
             (allocator_type *)in_stack_ffffffffffffe040);
  TransactionDescriptionString();
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe040,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe038);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_18e8 = 0;
  uStack_18e0 = 0;
  local_18d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             in_stack_ffffffffffffe084,in_stack_ffffffffffffe078,
             SUB41(in_stack_ffffffffffffe074 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe060,
             (bool)in_stack_ffffffffffffe05f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1908 = 0;
  uStack_1900 = 0;
  local_18f8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             in_stack_ffffffffffffe084,in_stack_ffffffffffffe078,
             SUB41(in_stack_ffffffffffffe074 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe060,
             (bool)in_stack_ffffffffffffe05f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1928 = 0;
  uStack_1920 = 0;
  local_1918 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
                 in_stack_ffffffffffffe050);
  local_1948 = 0;
  uStack_1940 = 0;
  local_1938 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1968 = 0;
  uStack_1960 = 0;
  local_1958 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             in_stack_ffffffffffffe084,in_stack_ffffffffffffe078,
             SUB41(in_stack_ffffffffffffe074 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe060,
             (bool)in_stack_ffffffffffffe05f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1988 = 0;
  uStack_1980 = 0;
  local_1978 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
                 in_stack_ffffffffffffe050);
  std::operator+(in_stack_ffffffffffffe020,(char *)in_stack_ffffffffffffe018);
  local_19a8 = (pointer)0x0;
  pbStack_19a0 = (pointer)0x0;
  local_1998._0_1_ = false;
  local_1998._1_1_ = false;
  local_1998._2_6_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  paVar2 = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             in_stack_ffffffffffffe084,in_stack_ffffffffffffe078,
             SUB41(in_stack_ffffffffffffe074 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe060,
             (bool)in_stack_ffffffffffffe05f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_19c8 = 0;
  aStack_19c0._M_allocated_capacity = 0;
  aStack_19c0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1a0c[4] = (allocator<char>)0x0;
  local_1a0c[5] = (allocator<char>)0x0;
  local_1a0c[6] = (allocator<char>)0x0;
  local_1a0c[7] = (allocator<char>)0x0;
  local_1a0c[8] = (allocator<char>)0x0;
  local_1a0c[9] = (allocator<char>)0x0;
  local_1a0c[10] = (allocator<char>)0x0;
  local_1a0c[0xb] = (allocator<char>)0x0;
  uStack_1a00._0_1_ = '\0';
  uStack_1a00._1_7_ = 0;
  local_19f8._M_p = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe058;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe050;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe05f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe048,__l_01,
             (allocator_type *)in_stack_ffffffffffffe040);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             in_stack_ffffffffffffe084,in_stack_ffffffffffffe078,
             SUB41(in_stack_ffffffffffffe074 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe060,
             (bool)in_stack_ffffffffffffe05f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe058;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe050;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe05f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe048,__l_02,
             (allocator_type *)in_stack_ffffffffffffe040);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe058;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe050;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe05f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe048,__l_03,
             (allocator_type *)in_stack_ffffffffffffe040);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  fun = local_aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1a29[1] = (allocator<char>)0x0;
  local_1a29[2] = (allocator<char>)0x0;
  local_1a29[3] = (allocator<char>)0x0;
  local_1a29[4] = (allocator<char>)0x0;
  local_1a29[5] = (allocator<char>)0x0;
  local_1a29[6] = (allocator<char>)0x0;
  local_1a29[7] = (allocator<char>)0x0;
  local_1a29[8] = (allocator<char>)0x0;
  local_1a29[9] = (allocator<char>)0x0;
  local_1a29[10] = (allocator<char>)0x0;
  local_1a29[0xb] = (allocator<char>)0x0;
  local_1a29[0xc] = (allocator<char>)0x0;
  local_1a29[0xd] = (allocator<char>)0x0;
  local_1a29[0xe] = (allocator<char>)0x0;
  local_1a29[0xf] = (allocator<char>)0x0;
  local_1a29[0x10] = (allocator<char>)0x0;
  local_1a29[0x11] = (allocator<char>)0x0;
  local_1a29[0x12] = (allocator<char>)0x0;
  local_1a29[0x13] = (allocator<char>)0x0;
  local_1a29[0x14] = (allocator<char>)0x0;
  local_1a29[0x15] = (allocator<char>)0x0;
  local_1a29[0x16] = (allocator<char>)0x0;
  local_1a29[0x17] = (allocator<char>)0x0;
  local_1a29[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  local_1a68 = (pointer)0x0;
  pRStack_1a60 = (pointer)0x0;
  local_1a58._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffe058;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe050;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffe05f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe048,__l_04,
             (allocator_type *)in_stack_ffffffffffffe040);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             in_stack_ffffffffffffe084,in_stack_ffffffffffffe078,
             SUB41(in_stack_ffffffffffffe074 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe06f,in_stack_ffffffffffffe068),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe060,
             (bool)in_stack_ffffffffffffe05f);
  RPCResult::RPCResult(in_stack_ffffffffffffe048,in_stack_ffffffffffffe040);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffe058;
  __l_05._M_array = (iterator)in_stack_ffffffffffffe050;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffe05f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe048,__l_05,
             (allocator_type *)in_stack_ffffffffffffe040);
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe040,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe038);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe090,in_stack_ffffffffffffe08c,
             (string *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080),
             in_stack_ffffffffffffe078,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe074,in_stack_ffffffffffffe070),
             (bool)in_stack_ffffffffffffe06f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe08c,in_stack_ffffffffffffe088),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe084,in_stack_ffffffffffffe080));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  HelpExampleCli((string *)in_stack_ffffffffffffe040,in_stack_ffffffffffffe038);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  HelpExampleCli((string *)in_stack_ffffffffffffe040,in_stack_ffffffffffffe038);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe040,in_stack_ffffffffffffe038);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  HelpExampleCli((string *)in_stack_ffffffffffffe040,in_stack_ffffffffffffe038);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe040,in_stack_ffffffffffffe038);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe05f,in_stack_ffffffffffffe058),
             (char *)in_stack_ffffffffffffe050,(allocator<char> *)in_stack_ffffffffffffe048);
  HelpExampleRpc((string *)in_stack_ffffffffffffe040,in_stack_ffffffffffffe038);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe040,in_stack_ffffffffffffe038);
  RPCExamples::RPCExamples((RPCExamples *)paVar2,(string *)0x5c1866);
  this = (RPCArg *)local_1a98;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::gettransaction()::__0,void>
            (in_stack_ffffffffffffe018,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe010);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
             in_stack_ffffffffffffe160,in_stack_ffffffffffffe158,in_stack_ffffffffffffe150,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1a98 + 0x26));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a71);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a70);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a6f);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a6e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a6d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a6c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1a6b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1e30 = local_908;
  do {
    local_1e30 = local_1e30 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1e30 != local_b28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1e48 = local_14a0;
  do {
    local_1e48 = local_1e48 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1e48 != local_1528);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1a58 + 0xe));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1a49);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1a29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a0d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1a0c);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1e60 = local_b68;
  do {
    local_1e60 = local_1e60 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1e60 != local_bf0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1e78 = local_c30;
  do {
    local_1e78 = local_1e78 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1e78 != local_10f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar4 = local_13e0;
  puVar1 = local_1358;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_19e9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19aa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1989);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_196a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1969);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_194a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1949);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1929);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_190a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1909);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_18ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_18e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_18c2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_18c1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_18a2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_18a1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1882);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1881);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar4 = local_868;
  puVar1 = local_758;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1829);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe018);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1801);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_17b2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_17b1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe018);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1ec0 = local_48;
  do {
    local_1ec0 = local_1ec0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1ec0 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1797);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1795);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1794);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1793);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1792);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1791);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1789);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_176a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1769);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan gettransaction()
{
    return RPCHelpMan{"gettransaction",
                "\nGet detailed information about in-wallet transaction <txid>\n",
                {
                    {"txid", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction id"},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"},
                            "Whether to include watch-only addresses in balance calculation and details[]"},
                    {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false},
                            "Whether to include a `decoded` field containing the decoded transaction (equivalent to RPC decoderawtransaction)"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "", Cat(Cat<std::vector<RPCResult>>(
                    {
                        {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                        {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the\n"
                                     "'send' category of transactions."},
                    },
                    TransactionDescriptionString()),
                    {
                        {RPCResult::Type::ARR, "details", "",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction."},
                                {RPCResult::Type::STR, "address", /*optional=*/true, "The bitcoin address involved in the transaction."},
                                {RPCResult::Type::STR, "category", "The transaction category.\n"
                                    "\"send\"                  Transactions sent.\n"
                                    "\"receive\"               Non-coinbase transactions received.\n"
                                    "\"generate\"              Coinbase transactions received with more than 100 confirmations.\n"
                                    "\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n"
                                    "\"orphan\"                Orphaned coinbase transactions received."},
                                {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                                {RPCResult::Type::STR, "label", /*optional=*/true, "A comment for the address/transaction, if any"},
                                {RPCResult::Type::NUM, "vout", "the vout value"},
                                {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the \n"
                                    "'send' category of transactions."},
                                {RPCResult::Type::BOOL, "abandoned", "'true' if the transaction has been abandoned (inputs are respendable)."},
                                {RPCResult::Type::ARR, "parent_descs", /*optional=*/true, "Only if 'category' is 'received'. List of parent descriptors for the output script of this coin.", {
                                    {RPCResult::Type::STR, "desc", "The descriptor string."},
                                }},
                            }},
                        }},
                        {RPCResult::Type::STR_HEX, "hex", "Raw data for transaction"},
                        {RPCResult::Type::OBJ, "decoded", /*optional=*/true, "The decoded transaction (only present when `verbose` is passed)",
                        {
                            {RPCResult::Type::ELISION, "", "Equivalent to the RPC decoderawtransaction method, or the RPC getrawtransaction method when `verbose` is passed."},
                        }},
                        RESULT_LAST_PROCESSED_BLOCK,
                    })
                },
                RPCExamples{
                    HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"")
            + HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" true")
            + HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" false true")
            + HelpExampleRpc("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    uint256 hash(ParseHashV(request.params[0], "txid"));

    isminefilter filter = ISMINE_SPENDABLE;

    if (ParseIncludeWatchonly(request.params[1], *pwallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    bool verbose = request.params[2].isNull() ? false : request.params[2].get_bool();

    UniValue entry(UniValue::VOBJ);
    auto it = pwallet->mapWallet.find(hash);
    if (it == pwallet->mapWallet.end()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid or non-wallet transaction id");
    }
    const CWalletTx& wtx = it->second;

    CAmount nCredit = CachedTxGetCredit(*pwallet, wtx, filter);
    CAmount nDebit = CachedTxGetDebit(*pwallet, wtx, filter);
    CAmount nNet = nCredit - nDebit;
    CAmount nFee = (CachedTxIsFromMe(*pwallet, wtx, filter) ? wtx.tx->GetValueOut() - nDebit : 0);

    entry.pushKV("amount", ValueFromAmount(nNet - nFee));
    if (CachedTxIsFromMe(*pwallet, wtx, filter))
        entry.pushKV("fee", ValueFromAmount(nFee));

    WalletTxToJSON(*pwallet, wtx, entry);

    UniValue details(UniValue::VARR);
    ListTransactions(*pwallet, wtx, 0, false, details, filter, /*filter_label=*/std::nullopt);
    entry.pushKV("details", std::move(details));

    entry.pushKV("hex", EncodeHexTx(*wtx.tx));

    if (verbose) {
        UniValue decoded(UniValue::VOBJ);
        TxToUniv(*wtx.tx, /*block_hash=*/uint256(), /*entry=*/decoded, /*include_hex=*/false);
        entry.pushKV("decoded", std::move(decoded));
    }

    AppendLastProcessedBlock(entry, *pwallet);
    return entry;
},
    };
}